

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O2

bool __thiscall GrcSymbolTableEntry::IsAttachXField(GrcSymbolTableEntry *this)

{
  Symbol __lhs;
  Symbol __lhs_00;
  bool bVar1;
  
  __lhs = this->m_psymtbl->m_psymParent;
  bVar1 = FitsSymbolType(this,ksymtSlotAttr);
  if (((__lhs != (Symbol)0x0 && bVar1) &&
      (__lhs_00 = __lhs->m_psymtbl->m_psymParent, __lhs_00 != (Symbol)0x0)) &&
     (bVar1 = std::operator==(&__lhs_00->m_staFieldName,"attach"), bVar1)) {
    bVar1 = std::operator==(&__lhs->m_staFieldName,"with");
    if ((!bVar1) && (bVar1 = std::operator==(&__lhs->m_staFieldName,"at"), !bVar1)) {
      return false;
    }
    bVar1 = std::operator==(&this->m_staFieldName,"x");
    return bVar1;
  }
  return false;
}

Assistant:

bool GrcSymbolTableEntry::IsAttachXField()
{
	Assert(FitsSymbolType(ksymtSlotAttr) || FitsSymbolType(ksymtFeature));
	Symbol psymParent = ParentSymbol();
	return (FitsSymbolType(ksymtSlotAttr)
		&& (psymParent && psymParent->ParentSymbol())
		&& (psymParent->ParentSymbol()->m_staFieldName == "attach")
		&& ((psymParent->m_staFieldName == "with") || (psymParent->m_staFieldName == "at"))
		&& m_staFieldName == "x");
}